

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  U32 *pUVar4;
  char cVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  byte bVar11;
  int *mEnd;
  BYTE *pBVar12;
  int *piVar13;
  uint uVar14;
  long lVar15;
  seqDef *psVar16;
  ulong uVar17;
  int *piVar18;
  BYTE *pBVar19;
  U32 UVar20;
  int *iLimit;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int *piVar25;
  ulong uVar26;
  uint uVar27;
  size_t offbaseFound;
  size_t local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  seqStore_t *local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  BYTE *local_70;
  ulong local_68;
  uint local_5c;
  uint *local_58;
  BYTE *local_50;
  BYTE *local_48;
  int *local_40;
  BYTE *local_38;
  
  pBVar2 = (ms->window).base;
  local_94 = (ms->cParams).minMatch;
  if (5 < local_94) {
    local_94 = 6;
  }
  if (local_94 < 5) {
    local_94 = 4;
  }
  local_98 = (ms->cParams).searchLog;
  uVar21 = 6;
  if (local_98 < 6) {
    uVar21 = local_98;
  }
  uVar8 = (ms->window).dictLimit;
  local_88 = (ulong)uVar8;
  if (uVar21 < 5) {
    uVar21 = 4;
  }
  local_70 = pBVar2 + local_88;
  pZVar3 = ms->dictMatchState;
  local_50 = (pZVar3->window).base;
  local_38 = local_50 + (pZVar3->window).dictLimit;
  local_78 = (int *)(pZVar3->window).nextSrc;
  uVar7 = ((int)src - ((int)local_38 + (int)local_70)) + (int)local_78;
  piVar25 = (int *)((long)src + (ulong)(uVar7 == 0));
  uVar22 = *rep;
  local_90 = seqStore;
  if (uVar7 < uVar22) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar27 = rep[1];
  local_9c = uVar22;
  local_58 = rep;
  if (uVar7 < uVar27) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_80 = (int *)((long)src + (srcSize - 0x10));
  ms->lazySkipping = 0;
  uVar7 = ms->nextToUpdate;
  uVar17 = (ulong)uVar7;
  uVar14 = ((int)local_80 - (int)(pBVar2 + uVar17)) + 1;
  uVar9 = 8;
  if (uVar14 < 8) {
    uVar9 = uVar14;
  }
  if (local_80 < pBVar2 + uVar17) {
    uVar9 = 0;
  }
  bVar11 = (byte)uVar21;
  if (uVar7 < uVar9 + uVar7) {
    UVar20 = ms->rowHashLog;
    if (0x20 < UVar20 + 8) {
LAB_0071984c:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar4 = ms->hashTable;
    pBVar19 = ms->tagTable;
    uVar26 = ms->hashSalt;
    local_68 = CONCAT44(local_68._4_4_,0x18 - UVar20);
    do {
      if (local_94 == 5) {
        uVar23 = *(long *)(pBVar2 + uVar17) * -0x30e4432345000000;
LAB_00718f4f:
        uVar23 = (uVar23 ^ uVar26) >> (0x38U - (char)UVar20 & 0x3f);
      }
      else {
        if (local_94 == 6) {
          uVar23 = *(long *)(pBVar2 + uVar17) * -0x30e4432340650000;
          goto LAB_00718f4f;
        }
        uVar23 = (ulong)((*(int *)(pBVar2 + uVar17) * -0x61c8864f ^ (uint)uVar26) >>
                        ((byte)(0x18 - UVar20) & 0x1f));
      }
      uVar14 = ((uint)(uVar23 >> 8) & 0xffffff) << (bVar11 & 0x1f);
      if (((ulong)(pUVar4 + uVar14) & 0x3f) != 0) {
LAB_00719754:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar19 + uVar14) & ~(-1L << (bVar11 & 0x3f))) != 0) {
LAB_00719735:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar17 & 7] = (U32)uVar23;
      uVar17 = uVar17 + 1;
    } while (uVar9 + uVar7 != uVar17);
  }
  iLimit = (int *)(srcSize + (long)src);
  if (piVar25 < local_80) {
    local_5c = ((int)local_50 - (int)local_78) + uVar8;
    local_48 = local_50 + -(ulong)local_5c;
    local_40 = iLimit + -8;
    local_68 = ~(-1L << (bVar11 & 0x3f));
    do {
      piVar13 = (int *)((long)piVar25 + 1);
      uVar8 = (((int)piVar25 - (int)pBVar2) - uVar22) + 1;
      piVar18 = (int *)(pBVar2 + uVar8);
      if (uVar8 < (uint)local_88) {
        piVar18 = (int *)(local_50 + (uVar8 - local_5c));
      }
      if ((uVar8 - (uint)local_88 < 0xfffffffd) && (*piVar18 == *piVar13)) {
        mEnd = iLimit;
        if (uVar8 < (uint)local_88) {
          mEnd = local_78;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar25 + 5),(BYTE *)(piVar18 + 1),(BYTE *)iLimit,
                            (BYTE *)mEnd,local_70);
        uVar17 = sVar10 + 4;
        UVar20 = 1;
LAB_007192d3:
        if (local_90->maxNbSeq <=
            (ulong)((long)local_90->sequences - (long)local_90->sequencesStart >> 3)) {
LAB_007197d0:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_90->maxNbLit) {
LAB_007197b1:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar26 = (long)piVar13 - (long)src;
        pBVar19 = local_90->lit;
        if (local_90->litStart + local_90->maxNbLit < pBVar19 + uVar26) {
LAB_00719773:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < piVar13) {
LAB_00719792:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < piVar13) {
          ZSTD_safecopyLiterals(pBVar19,(BYTE *)src,(BYTE *)piVar13,(BYTE *)local_40);
LAB_00719347:
          local_90->lit = local_90->lit + uVar26;
          if (0xffff < uVar26) {
            if (local_90->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_90->longLengthType = ZSTD_llt_literalLength;
            local_90->longLengthPos =
                 (U32)((ulong)((long)local_90->sequences - (long)local_90->sequencesStart) >> 3);
          }
        }
        else {
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar19 = *src;
          *(undefined8 *)(pBVar19 + 8) = uVar6;
          pBVar19 = local_90->lit;
          if (0x10 < uVar26) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar19 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar19 + 0x18) = uVar6;
            if (0x20 < (long)uVar26) {
              lVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
                uVar6 = puVar1[1];
                pBVar12 = pBVar19 + lVar15 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar15 = lVar15 + 0x20;
              } while (pBVar12 + 0x20 < pBVar19 + uVar26);
            }
            goto LAB_00719347;
          }
          local_90->lit = pBVar19 + uVar26;
        }
        psVar16 = local_90->sequences;
        psVar16->litLength = (U16)uVar26;
        psVar16->offBase = UVar20;
        if (uVar17 < 3) {
LAB_007197ef:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar17 - 3) {
          if (local_90->longLengthType != ZSTD_llt_none) {
LAB_0071980e:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_90->longLengthType = ZSTD_llt_matchLength;
          local_90->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)local_90->sequencesStart) >> 3);
        }
        psVar16->mlBase = (U16)(uVar17 - 3);
        psVar16 = psVar16 + 1;
        local_90->sequences = psVar16;
        if (ms->lazySkipping != 0) {
          uVar8 = ms->nextToUpdate;
          uVar26 = (ulong)uVar8;
          uVar7 = ((int)local_80 - (int)(pBVar2 + uVar26)) + 1;
          if (7 < uVar7) {
            uVar7 = 8;
          }
          if (local_80 < pBVar2 + uVar26) {
            uVar7 = 0;
          }
          local_9c = uVar22;
          if (uVar8 < uVar7 + uVar8) {
            if (0x20 < ms->rowHashLog + 8) goto LAB_0071984c;
            pUVar4 = ms->hashTable;
            pBVar19 = ms->tagTable;
            uVar23 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (local_94 == 5) {
                uVar24 = *(long *)(pBVar2 + uVar26) * -0x30e4432345000000;
LAB_00719502:
                uVar9 = (uint)((uVar24 ^ uVar23) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (local_94 == 6) {
                  uVar24 = *(long *)(pBVar2 + uVar26) * -0x30e4432340650000;
                  goto LAB_00719502;
                }
                uVar9 = (*(int *)(pBVar2 + uVar26) * -0x61c8864f ^ (uint)uVar23) >>
                        (0x18U - cVar5 & 0x1f);
              }
              uVar14 = (uVar9 >> 8) << (bVar11 & 0x1f);
              if (((ulong)(pUVar4 + uVar14) & 0x3f) != 0) goto LAB_00719754;
              if ((local_68 & (ulong)(pBVar19 + uVar14)) != 0) goto LAB_00719735;
              ms->hashCache[(uint)uVar26 & 7] = uVar9;
              uVar26 = uVar26 + 1;
            } while (uVar7 + uVar8 != uVar26);
          }
          ms->lazySkipping = 0;
        }
        piVar25 = (int *)((long)piVar13 + uVar17);
        src = piVar25;
        uVar8 = uVar27;
        if (piVar25 <= local_80) {
          do {
            uVar7 = uVar22;
            uVar9 = ((int)piVar25 - (int)pBVar2) - uVar8;
            pBVar19 = pBVar2;
            if (uVar9 < (uint)local_88) {
              pBVar19 = local_48;
            }
            src = piVar25;
            uVar27 = uVar8;
            uVar22 = uVar7;
            if ((0xfffffffc < uVar9 - (uint)local_88) || (*(int *)(pBVar19 + uVar9) != *piVar25))
            break;
            piVar13 = iLimit;
            if (uVar9 < (uint)local_88) {
              piVar13 = local_78;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar25 + 1),(BYTE *)((long)(pBVar19 + uVar9) + 4),
                                (BYTE *)iLimit,(BYTE *)piVar13,local_70);
            if (local_90->maxNbSeq <= (ulong)((long)psVar16 - (long)local_90->sequencesStart >> 3))
            goto LAB_007197d0;
            if (0x20000 < local_90->maxNbLit) goto LAB_007197b1;
            pBVar19 = local_90->lit;
            if (local_90->litStart + local_90->maxNbLit < pBVar19) goto LAB_00719773;
            if (iLimit < piVar25) goto LAB_00719792;
            if (local_40 < piVar25) {
              ZSTD_safecopyLiterals(pBVar19,(BYTE *)piVar25,(BYTE *)piVar25,(BYTE *)local_40);
            }
            else {
              uVar6 = *(undefined8 *)(piVar25 + 2);
              *(undefined8 *)pBVar19 = *(undefined8 *)piVar25;
              *(undefined8 *)(pBVar19 + 8) = uVar6;
            }
            psVar16 = local_90->sequences;
            psVar16->litLength = 0;
            psVar16->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_007197ef;
            if (0xffff < sVar10 + 1) {
              if (local_90->longLengthType != ZSTD_llt_none) goto LAB_0071980e;
              local_90->longLengthType = ZSTD_llt_matchLength;
              local_90->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)local_90->sequencesStart) >> 3);
            }
            psVar16->mlBase = (U16)(sVar10 + 1);
            psVar16 = psVar16 + 1;
            local_90->sequences = psVar16;
            piVar25 = (int *)((long)piVar25 + sVar10 + 4);
            src = piVar25;
            uVar27 = uVar7;
            uVar22 = uVar8;
            uVar8 = uVar7;
          } while (piVar25 <= local_80);
        }
      }
      else {
        local_a8 = 999999999;
        if (local_94 == 6) {
          if (uVar21 == 6) {
            uVar17 = ZSTD_RowFindBestMatch_dictMatchState_6_6
                               (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
          }
          else if (uVar21 == 5) {
            uVar17 = ZSTD_RowFindBestMatch_dictMatchState_6_5
                               (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
          }
          else {
            uVar17 = ZSTD_RowFindBestMatch_dictMatchState_6_4
                               (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
          }
        }
        else if (local_94 == 5) {
          if (uVar21 == 6) {
            uVar17 = ZSTD_RowFindBestMatch_dictMatchState_5_6
                               (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
          }
          else if (uVar21 == 5) {
            uVar17 = ZSTD_RowFindBestMatch_dictMatchState_5_5
                               (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
          }
          else {
            uVar17 = ZSTD_RowFindBestMatch_dictMatchState_5_4
                               (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
          }
        }
        else if (uVar21 == 6) {
          uVar17 = ZSTD_RowFindBestMatch_dictMatchState_4_6
                             (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
        }
        else if (uVar21 == 5) {
          uVar17 = ZSTD_RowFindBestMatch_dictMatchState_4_5
                             (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
        }
        else {
          uVar17 = ZSTD_RowFindBestMatch_dictMatchState_4_4
                             (ms,(BYTE *)piVar25,(BYTE *)iLimit,&local_a8);
        }
        uVar26 = local_a8;
        piVar18 = piVar25;
        if (uVar17 == 0) {
          uVar26 = 1;
          piVar18 = piVar13;
        }
        piVar13 = piVar18;
        UVar20 = (U32)uVar26;
        if (3 < uVar17) {
          if (3 < local_a8) {
            uVar26 = (long)piVar25 + (-0xfffffffd - (long)(pBVar2 + local_a8));
            pBVar12 = pBVar2;
            pBVar19 = local_70;
            if ((uint)uVar26 < (uint)local_88) {
              pBVar12 = local_48;
              pBVar19 = local_38;
            }
            if ((src < piVar25) && (uVar26 = uVar26 & 0xffffffff, pBVar19 < pBVar12 + uVar26)) {
              pBVar12 = pBVar12 + uVar26;
              do {
                piVar25 = (int *)((long)piVar13 + -1);
                pBVar12 = pBVar12 + -1;
                if ((*(BYTE *)piVar25 != *pBVar12) ||
                   (uVar17 = uVar17 + 1, piVar13 = piVar25, piVar25 <= src)) break;
              } while (pBVar19 < pBVar12);
            }
            uVar27 = uVar22;
            uVar22 = UVar20 - 3;
          }
          goto LAB_007192d3;
        }
        uVar17 = (long)piVar25 - (long)src;
        piVar25 = (int *)((long)piVar25 + (uVar17 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar17);
      }
      rep = local_58;
    } while (piVar25 < local_80);
  }
  *rep = uVar22;
  rep[1] = uVar27;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_dictMatchState);
}